

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O3

extraction_status_t __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
::extract_demand_from_not_empty_queue
          (mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
           *this,demand_t *dest)

{
  limited_dynamic_demand_queue *queue;
  atomic_refcounted_t *paVar1;
  invocation_type_t iVar2;
  _Map_pointer ppdVar3;
  _Elt_pointer pdVar4;
  _Elt_pointer pdVar5;
  size_t sVar6;
  _Map_pointer ppdVar7;
  _Elt_pointer pdVar8;
  _Elt_pointer pdVar9;
  _Elt_pointer pdVar10;
  message_t *pmVar11;
  message_t *pmVar12;
  invocation_type_t __tmp_1;
  type_index __tmp;
  message_t *t;
  
  ppdVar3 = (this->m_queue).m_queue.
            super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  pdVar4 = (this->m_queue).m_queue.
           super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  pdVar5 = (this->m_queue).m_queue.
           super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  sVar6 = (this->m_queue).m_max_size;
  queue = &this->m_queue;
  ppdVar7 = (this->m_queue).m_queue.
            super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pdVar8 = (this->m_queue).m_queue.
           super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
  pdVar9 = (this->m_queue).m_queue.
           super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  details::ensure_queue_not_empty<so_5::mchain_props::details::limited_dynamic_demand_queue&>(queue)
  ;
  pdVar10 = (this->m_queue).m_queue.
            super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pmVar11 = (pdVar10->m_message_ref).m_obj;
  (pdVar10->m_message_ref).m_obj = (message_t *)0x0;
  iVar2 = pdVar10->m_demand_type;
  (dest->m_msg_type)._M_target = (pdVar10->m_msg_type)._M_target;
  pmVar12 = (dest->m_message_ref).m_obj;
  (dest->m_message_ref).m_obj = pmVar11;
  dest->m_demand_type = iVar2;
  if (pmVar12 != (message_t *)0x0) {
    LOCK();
    paVar1 = &pmVar12->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if ((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) {
      (*pmVar12->_vptr_message_t[1])();
    }
  }
  details::ensure_queue_not_empty<so_5::mchain_props::details::limited_dynamic_demand_queue&>(queue)
  ;
  std::deque<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>::pop_front
            (&queue->m_queue);
  if (sVar6 == ((long)pdVar4 - (long)pdVar9 >> 3) * -0x5555555555555555 +
               ((long)pdVar5 - (long)pdVar8 >> 3) * -0x5555555555555555 +
               (((long)ppdVar3 - (long)ppdVar7 >> 3) + -1 + (ulong)(ppdVar3 == (_Map_pointer)0x0)) *
               0x15) {
    std::condition_variable::notify_all();
  }
  return msg_extracted;
}

Assistant:

extraction_status_t
		extract_demand_from_not_empty_queue(
			demand_t & dest )
			{
				// If queue was full then someone can wait on it.
				const bool queue_was_full = m_queue.is_full();
				dest = std::move( m_queue.front() );
				m_queue.pop_front();

				this->trace_extracted_demand( *this, dest );

				if( queue_was_full )
					m_overflow_cond.notify_all();

				return extraction_status_t::msg_extracted;
			}